

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

string * __thiscall
upb::generator::FieldInitializer_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,FieldDefPtr field,
          upb_MiniTableField *field64,upb_MiniTableField *field32)

{
  ushort uVar1;
  upb_MiniTableField *size64;
  AlphaNum *a;
  string_view format;
  Arg *a5;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  Arg local_178;
  Arg local_148;
  Arg local_118;
  AlphaNum local_e8;
  Arg local_b8;
  Arg local_88;
  Arg local_58;
  
  size64 = field64;
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_b8,*(uint *)&(field.ptr_)->opts);
  ArchDependentSize_abi_cxx11_
            (&local_198,(generator *)(ulong)field64->offset_dont_copy_me__upb_internal_use_only,
             (ulong)*(ushort *)((long)&(field.ptr_)->opts + 4),(int64_t)size64);
  local_118.piece_._M_len = local_198._M_string_length;
  local_118.piece_._M_str = local_198._M_dataplus._M_p;
  ArchDependentSize_abi_cxx11_
            (&local_1d8,(generator *)(long)field64->presence,
             (long)*(short *)((long)&(field.ptr_)->opts + 6),local_198._M_string_length);
  local_148.piece_._M_len = local_1d8._M_string_length;
  local_148.piece_._M_str = local_1d8._M_dataplus._M_p;
  uVar1 = *(ushort *)&(field.ptr_)->resolved_features;
  if (uVar1 == 0xffff) {
    local_1b8._M_dataplus._M_p = "kUpb_NoSub";
  }
  else {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_e8,(uint)uVar1);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_1b8,(lts_20250127 *)&local_e8,a);
  }
  local_178.piece_ = absl::lts_20250127::NullSafeStringView(local_1b8._M_dataplus._M_p);
  absl::lts_20250127::substitute_internal::Arg::Arg
            (&local_58,(uint)*(byte *)((long)&(field.ptr_)->resolved_features + 2));
  a5 = (Arg *)0x2606b9;
  GetModeInit_abi_cxx11_
            (&local_1f8,(generator *)field64,(upb_MiniTableField *)field.ptr_,
             (upb_MiniTableField *)local_1d8._M_string_length);
  local_88.piece_._M_len = local_1f8._M_string_length;
  local_88.piece_._M_str = local_1f8._M_dataplus._M_p;
  format._M_str = (char *)&local_b8;
  format._M_len = (size_t)"{$0, $1, $2, $3, $4, $5}";
  absl::lts_20250127::Substitute_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)0x18,format,&local_118,&local_148,&local_178,
             &local_58,&local_88,a5);
  std::__cxx11::string::~string((string *)&local_1f8);
  if (uVar1 != 0xffff) {
    std::__cxx11::string::~string((string *)&local_1b8);
  }
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldInitializer(upb::FieldDefPtr field,
                             const upb_MiniTableField* field64,
                             const upb_MiniTableField* field32) {
  return absl::Substitute(
      "{$0, $1, $2, $3, $4, $5}", upb_MiniTableField_Number(field64),
      ArchDependentSize(field32->UPB_PRIVATE(offset),
                        field64->UPB_PRIVATE(offset)),
      ArchDependentSize(field32->presence, field64->presence),
      field64->UPB_PRIVATE(submsg_index) == kUpb_NoSub
          ? "kUpb_NoSub"
          : absl::StrCat(field64->UPB_PRIVATE(submsg_index)).c_str(),
      field64->UPB_PRIVATE(descriptortype), GetModeInit(field32, field64));
}